

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

void __thiscall
FIX::double_conversion::Bignum::AssignPowerUInt16(Bignum *this,uint16_t base,int power_exponent)

{
  bool bVar1;
  bool high_bits_zero;
  uint64_t base_bits_mask;
  uint64_t max_32bits;
  ulong uStack_38;
  bool delayed_multipliciation;
  uint64_t this_value;
  int mask;
  int final_size;
  int tmp_base;
  int bit_size;
  int shifts;
  int power_exponent_local;
  uint16_t base_local;
  Bignum *this_local;
  
  if (base == 0) {
    __assert_fail("base != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x19d,"void FIX::double_conversion::Bignum::AssignPowerUInt16(uint16_t, int)");
  }
  if (-1 < power_exponent) {
    if (power_exponent == 0) {
      AssignUInt16(this,1);
    }
    else {
      Zero(this);
      tmp_base = 0;
      for (shifts._2_2_ = base; (shifts._2_2_ & 1) == 0;
          shifts._2_2_ = (uint16_t)((int)(uint)shifts._2_2_ >> 1)) {
        tmp_base = tmp_base + 1;
      }
      final_size = 0;
      for (mask = (int)shifts._2_2_; mask != 0; mask = mask >> 1) {
        final_size = final_size + 1;
      }
      EnsureCapacity(this,(final_size * power_exponent) / 0x1c + 2);
      for (this_value._4_4_ = 1; (int)this_value._4_4_ <= power_exponent;
          this_value._4_4_ = this_value._4_4_ << 1) {
      }
      uStack_38 = (ulong)shifts._2_2_;
      bVar1 = false;
      for (this_value._4_4_ = (int)this_value._4_4_ >> 2;
          this_value._4_4_ != 0 && uStack_38 < 0x100000000;
          this_value._4_4_ = (int)this_value._4_4_ >> 1) {
        uStack_38 = uStack_38 * uStack_38;
        if ((power_exponent & this_value._4_4_) != 0) {
          if ((uStack_38 & ((1L << (0x40U - (char)final_size & 0x3f)) - 1U ^ 0xffffffffffffffff)) ==
              0) {
            uStack_38 = shifts._2_2_ * uStack_38;
          }
          else {
            bVar1 = true;
          }
        }
      }
      AssignUInt64(this,uStack_38);
      if (bVar1) {
        MultiplyByUInt32(this,(uint)shifts._2_2_);
      }
      for (; this_value._4_4_ != 0; this_value._4_4_ = (int)this_value._4_4_ >> 1) {
        Square(this);
        if ((power_exponent & this_value._4_4_) != 0) {
          MultiplyByUInt32(this,(uint)shifts._2_2_);
        }
      }
      ShiftLeft(this,tmp_base * power_exponent);
    }
    return;
  }
  __assert_fail("power_exponent >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                ,0x19e,"void FIX::double_conversion::Bignum::AssignPowerUInt16(uint16_t, int)");
}

Assistant:

void Bignum::AssignPowerUInt16(uint16_t base, int power_exponent) {
  ASSERT(base != 0);
  ASSERT(power_exponent >= 0);
  if (power_exponent == 0) {
    AssignUInt16(1);
    return;
  }
  Zero();
  int shifts = 0;
  // We expect base to be in range 2-32, and most often to be 10.
  // It does not make much sense to implement different algorithms for counting
  // the bits.
  while ((base & 1) == 0) {
    base >>= 1;
    shifts++;
  }
  int bit_size = 0;
  int tmp_base = base;
  while (tmp_base != 0) {
    tmp_base >>= 1;
    bit_size++;
  }
  int final_size = bit_size * power_exponent;
  // 1 extra bigit for the shifting, and one for rounded final_size.
  EnsureCapacity(final_size / kBigitSize + 2);

  // Left to Right exponentiation.
  int mask = 1;
  while (power_exponent >= mask) mask <<= 1;

  // The mask is now pointing to the bit above the most significant 1-bit of
  // power_exponent.
  // Get rid of first 1-bit;
  mask >>= 2;
  uint64_t this_value = base;

  bool delayed_multipliciation = false;
  const uint64_t max_32bits = 0xFFFFFFFF;
  while (mask != 0 && this_value <= max_32bits) {
    this_value = this_value * this_value;
    // Verify that there is enough space in this_value to perform the
    // multiplication.  The first bit_size bits must be 0.
    if ((power_exponent & mask) != 0) {
      uint64_t base_bits_mask =
          ~((static_cast<uint64_t>(1) << (64 - bit_size)) - 1);
      bool high_bits_zero = (this_value & base_bits_mask) == 0;
      if (high_bits_zero) {
        this_value *= base;
      } else {
        delayed_multipliciation = true;
      }
    }
    mask >>= 1;
  }
  AssignUInt64(this_value);
  if (delayed_multipliciation) {
    MultiplyByUInt32(base);
  }

  // Now do the same thing as a bignum.
  while (mask != 0) {
    Square();
    if ((power_exponent & mask) != 0) {
      MultiplyByUInt32(base);
    }
    mask >>= 1;
  }

  // And finally add the saved shifts.
  ShiftLeft(shifts * power_exponent);
}